

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

Node * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::FindChild
          (Node *this,StringPiece name)

{
  Node *pNVar1;
  pointer __s1;
  size_t size;
  int iVar2;
  pointer ppNVar3;
  ulong uVar4;
  stringpiece_ssize_type len;
  bool bVar5;
  
  if (((name.length_ != 0) && (this->kind_ == OBJECT)) &&
     (ppNVar3 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (this->children_).
     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
     ._M_impl.super__Vector_impl_data._M_finish != ppNVar3)) {
    uVar4 = 0;
    do {
      pNVar1 = ppNVar3[uVar4];
      __s1 = (pNVar1->name_)._M_dataplus._M_p;
      size = (pNVar1->name_)._M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
      }
      if (size == name.length_) {
        bVar5 = true;
        if (0 < (long)size && __s1 != name.ptr_) {
          iVar2 = bcmp(__s1,name.ptr_,size);
          bVar5 = iVar2 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        return pNVar1;
      }
      uVar4 = uVar4 + 1;
      ppNVar3 = (this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->children_).
                                   super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3))
    ;
  }
  return (Node *)0x0;
}

Assistant:

DefaultValueObjectWriter::Node* DefaultValueObjectWriter::Node::FindChild(
    StringPiece name) {
  if (name.empty() || kind_ != OBJECT) {
    return nullptr;
  }
  for (int i = 0; i < children_.size(); ++i) {
    Node* child = children_[i];
    if (child->name() == name) {
      return child;
    }
  }
  return nullptr;
}